

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_get_qmlevel_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1db5932::GetQmLevelTest_AllIntra_Test::~GetQmLevelTest_AllIntra_Test
          (GetQmLevelTest_AllIntra_Test *this)

{
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST(GetQmLevelTest, AllIntra) {
  // Get some QM levels from representative qindex values.
  int qindex_1_qmlevel = aom_get_qmlevel_allintra(1, DEFAULT_QM_FIRST_ALLINTRA,
                                                  DEFAULT_QM_LAST_ALLINTRA);
  int qindex_60_qmlevel = aom_get_qmlevel_allintra(
      60, DEFAULT_QM_FIRST_ALLINTRA, DEFAULT_QM_LAST_ALLINTRA);
  int qindex_120_qmlevel = aom_get_qmlevel_allintra(
      120, DEFAULT_QM_FIRST_ALLINTRA, DEFAULT_QM_LAST_ALLINTRA);
  int qindex_180_qmlevel = aom_get_qmlevel_allintra(
      180, DEFAULT_QM_FIRST_ALLINTRA, DEFAULT_QM_LAST_ALLINTRA);
  int qindex_255_qmlevel = aom_get_qmlevel_allintra(
      255, DEFAULT_QM_FIRST_ALLINTRA, DEFAULT_QM_LAST_ALLINTRA);

  // Extreme qindex values should also result in extreme QM levels.
  EXPECT_EQ(qindex_1_qmlevel, DEFAULT_QM_LAST_ALLINTRA);
  EXPECT_EQ(qindex_255_qmlevel, DEFAULT_QM_FIRST_ALLINTRA);

  // Unlike with aom_get_qmlevel(), aom_get_qmlevel_allintra() QMs become
  // flatter (i.e. QM levels become higher) the lower the qindex.
  EXPECT_LE(qindex_255_qmlevel, qindex_180_qmlevel);
  EXPECT_LE(qindex_180_qmlevel, qindex_120_qmlevel);
  EXPECT_LE(qindex_120_qmlevel, qindex_60_qmlevel);
  EXPECT_LE(qindex_60_qmlevel, qindex_1_qmlevel);
  EXPECT_LT(qindex_255_qmlevel, qindex_1_qmlevel);

  // Set min and max QM levels to be lower than DEFAULT_QM_FIRST_ALLINTRA.
  int qindex_1_qmlevel_belowfirst =
      aom_get_qmlevel_allintra(1, 1, DEFAULT_QM_FIRST_ALLINTRA - 1);
  int qindex_255_qmlevel_belowfirst =
      aom_get_qmlevel_allintra(255, 1, DEFAULT_QM_FIRST_ALLINTRA - 1);

  // Formula should always respect QM level boundaries, even when they're below
  // DEFAULT_QM_FIRST_ALLINTRA.
  EXPECT_EQ(qindex_1_qmlevel_belowfirst, DEFAULT_QM_FIRST_ALLINTRA - 1);
  EXPECT_EQ(qindex_255_qmlevel_belowfirst, DEFAULT_QM_FIRST_ALLINTRA - 1);

  // Set min and max QM levels to be higher than DEFAULT_QM_LAST_ALLINTRA.
  int qindex_1_qmlevel_abovelast =
      aom_get_qmlevel_allintra(1, DEFAULT_QM_LAST_ALLINTRA + 1, 15);
  int qindex_255_qmlevel_abovelast =
      aom_get_qmlevel_allintra(255, DEFAULT_QM_LAST_ALLINTRA + 1, 15);

  // Formula should always respect QM level boundaries, even when they're above
  // DEFAULT_QM_LAST_ALLINTRA.
  EXPECT_EQ(qindex_1_qmlevel_abovelast, DEFAULT_QM_LAST_ALLINTRA + 1);
  EXPECT_EQ(qindex_255_qmlevel_abovelast, DEFAULT_QM_LAST_ALLINTRA + 1);
}